

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

uint16_t __thiscall Color::to_bgr_word(Color *this)

{
  uint16_t color_word;
  Color *this_local;
  
  if ((this->_invalid & 1U) == 0) {
    this_local._6_2_ =
         (ushort)((int)(uint)this->_r >> 4) | (ushort)(((int)(uint)this->_g >> 4) << 4) |
         (ushort)(((int)(uint)this->_b >> 4) << 8);
  }
  else {
    this_local._6_2_ = 0xffff;
  }
  return this_local._6_2_;
}

Assistant:

[[nodiscard]] uint16_t Color::to_bgr_word() const
{
    if(_invalid)
        return 0xFFFF;

    uint16_t color_word = 0;
    color_word |= _r >> 4;
    color_word |= (_g >> 4) << 4;
    color_word |= (_b >> 4) << 8;
    return color_word;
}